

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Sphere::writeTo(Sphere *this,BinaryWriter *binary)

{
  Shape::writeTo(&this->super_Shape,binary);
  BinaryWriter::writeRaw(binary,&this->radius,4);
  BinaryWriter::writeRaw(binary,&this->transform,0x30);
  return 0x34;
}

Assistant:

int Sphere::writeTo(BinaryWriter &binary) 
  {
    Shape::writeTo(binary);
    binary.write(radius);
    binary.write(transform);
    return TYPE_SPHERE;
  }